

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::EGLThread::deinit(EGLThread *this)

{
  Library *pLVar1;
  EGLDisplay pvVar2;
  bool bVar3;
  GLES2Context *pGVar4;
  EGLThread *this_local;
  
  bVar3 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&this->runtimeContext);
  if (bVar3) {
    pGVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                       (&this->runtimeContext);
    if (pGVar4->context != (EGLContext)0x0) {
      pLVar1 = this->egl;
      pGVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                         (&this->runtimeContext);
      (*pLVar1->_vptr_Library[0x27])(pLVar1,pGVar4->display,0,0);
    }
    pLVar1 = this->egl;
    pGVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                       (&this->runtimeContext);
    pvVar2 = pGVar4->display;
    pGVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                       (&this->runtimeContext);
    (*pLVar1->_vptr_Library[0x13])(pLVar1,pvVar2,pGVar4->context);
    pGVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                       (&this->runtimeContext);
    pGVar4->context = (EGLContext)0x0;
    pLVar1 = this->egl;
    pGVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                       (&this->runtimeContext);
    (*pLVar1->_vptr_Library[0x16])(pLVar1,pGVar4->display,this->eglSurface);
    this->eglSurface = (EGLSurface)0x0;
  }
  (*this->egl->_vptr_Library[0x2d])();
  return;
}

Assistant:

void EGLThread::deinit (void)
{
	if (runtimeContext)
	{
		if (runtimeContext->context != EGL_NO_CONTEXT)
			egl.makeCurrent(runtimeContext->display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);

		egl.destroyContext(runtimeContext->display, runtimeContext->context);
		runtimeContext->context = EGL_NO_CONTEXT;

		egl.destroySurface(runtimeContext->display, eglSurface);
		eglSurface	= EGL_NO_SURFACE;
	}

	egl.releaseThread();
}